

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_common.c
# Opt level: O3

int hash_iter_keys(HashTable *table,void **_key,void **iter)

{
  undefined8 *puVar1;
  uint32 uVar2;
  int iVar3;
  ulong uVar4;
  HashItem *pHVar5;
  ulong uVar6;
  void *pvVar7;
  
  puVar1 = (undefined8 *)*iter;
  if (puVar1 == (undefined8 *)0x0) {
    uVar6 = 0;
  }
  else {
    pHVar5 = (HashItem *)puVar1[2];
    if (pHVar5 != (HashItem *)0x0) goto LAB_001249bd;
    uVar2 = (*table->hash)((void *)*puVar1,table->data);
    uVar6 = (ulong)((table->table_len - 1 & uVar2) + 1);
  }
  uVar4 = (ulong)table->table_len;
  if (table->table_len < (uint)uVar6) {
    uVar4 = uVar6;
  }
  do {
    if (uVar4 == uVar6) {
      pHVar5 = (HashItem *)0x0;
      pvVar7 = (void *)0x0;
      iVar3 = 0;
      goto LAB_001249cd;
    }
    pHVar5 = table->table[uVar6];
    uVar6 = uVar6 + 1;
  } while (pHVar5 == (HashItem *)0x0);
LAB_001249bd:
  pvVar7 = pHVar5->key;
  iVar3 = 1;
LAB_001249cd:
  *_key = pvVar7;
  *iter = pHVar5;
  return iVar3;
}

Assistant:

int hash_iter_keys(const HashTable *table, const void **_key, void **iter)
{
    HashItem *item = (HashItem *) *iter;
    uint32 idx = 0;

    if (item != NULL)
    {
        const HashItem *orig = item;
        item = item->next;
        if (item == NULL)
            idx = calc_hash(table, orig->key) + 1;
    } // if

    while (!item && (idx < table->table_len))
        item = table->table[idx++];  // skip empty buckets...

    if (item == NULL)  // no more matches?
    {
        *_key = NULL;
        *iter = NULL;
        return 0;
    } // if

    *_key = item->key;
    *iter = item;
    return 1;
}